

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O0

void * ngx_http_fastcgi_create_main_conf(ngx_conf_t *cf)

{
  ngx_int_t nVar1;
  ngx_http_fastcgi_main_conf_t *conf;
  ngx_conf_t *cf_local;
  
  cf_local = (ngx_conf_t *)ngx_pcalloc(cf->pool,0x28);
  if (cf_local == (ngx_conf_t *)0x0) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    nVar1 = ngx_array_init((ngx_array_t *)cf_local,cf->pool,4,8);
    if (nVar1 != 0) {
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  return cf_local;
}

Assistant:

static void *
ngx_http_fastcgi_create_main_conf(ngx_conf_t *cf)
{
    ngx_http_fastcgi_main_conf_t  *conf;

    conf = ngx_pcalloc(cf->pool, sizeof(ngx_http_fastcgi_main_conf_t));
    if (conf == NULL) {
        return NULL;
    }

#if (NGX_HTTP_CACHE)
    if (ngx_array_init(&conf->caches, cf->pool, 4,
                       sizeof(ngx_http_file_cache_t *))
        != NGX_OK)
    {
        return NULL;
    }
#endif

    return conf;
}